

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O3

void __thiscall
capnp::MallocMessageBuilder::MallocMessageBuilder
          (MallocMessageBuilder *this,ArrayPtr<capnp::word> firstSegment,
          AllocationStrategy allocationStrategy)

{
  Fault f;
  Fault local_18;
  
  (this->super_MessageBuilder).allocatedArena = false;
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__MallocMessageBuilder_00624638;
  *(int *)&(this->super_MessageBuilder).field_0xbc = (int)firstSegment.size_;
  this->allocationStrategy = allocationStrategy;
  this->ownFirstSegment = false;
  this->returnedFirstSegment = false;
  this->firstSegment = firstSegment.ptr;
  (this->moreSegments).builder.ptr = (void **)0x0;
  (this->moreSegments).builder.pos = (RemoveConst<void_*> *)0x0;
  (this->moreSegments).builder.endPtr = (void **)0x0;
  if (firstSegment.size_ == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0xd0,FAILED,"firstSegment.size() > 0","\"First segment size must be non-zero.\"",
               (char (*) [37])"First segment size must be non-zero.");
    kj::_::Debug::Fault::fatal(&local_18);
  }
  if ((firstSegment.ptr)->content == 0) {
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[30]>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
             ,0xd4,FAILED,"*reinterpret_cast<uint64_t*>(firstSegment.begin()) == 0",
             "\"First segment must be zeroed.\"",(char (*) [30])"First segment must be zeroed.");
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

MallocMessageBuilder::MallocMessageBuilder(
    kj::ArrayPtr<word> firstSegment, AllocationStrategy allocationStrategy)
    : nextSize(firstSegment.size()), allocationStrategy(allocationStrategy),
      ownFirstSegment(false), returnedFirstSegment(false), firstSegment(firstSegment.begin()) {
  KJ_REQUIRE(firstSegment.size() > 0, "First segment size must be non-zero.");

  // Checking just the first word should catch most cases of failing to zero the segment.
  KJ_REQUIRE(*reinterpret_cast<uint64_t*>(firstSegment.begin()) == 0,
          "First segment must be zeroed.");
}